

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int uv_poll_start(uv_poll_t *handle,int pevents,uv_poll_cb poll_cb)

{
  uv__io_t **ppuVar1;
  int iVar2;
  uint local_3c;
  int events;
  uv__io_t *w;
  uv__io_t **watchers;
  uv_poll_cb poll_cb_local;
  int pevents_local;
  uv_poll_t *handle_local;
  
  if ((pevents & 0xfffffff0U) != 0) {
    __assert_fail("(pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT | UV_PRIORITIZED)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/poll.c"
                  ,0x7d,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
  }
  if ((handle->flags & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/poll.c"
                  ,0x7e,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
  }
  ppuVar1 = handle->loop->watchers;
  iVar2 = uv__fd_exists(handle->loop,(handle->io_watcher).fd);
  if ((iVar2 == 0) || (ppuVar1[(handle->io_watcher).fd] == &handle->io_watcher)) {
    uv__poll_stop(handle);
    if (pevents == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      local_3c = (uint)((pevents & 1U) != 0);
      if ((pevents & 8U) != 0) {
        local_3c = local_3c | 2;
      }
      if ((pevents & 2U) != 0) {
        local_3c = local_3c | 4;
      }
      if ((pevents & 4U) != 0) {
        local_3c = local_3c | 0x2000;
      }
      uv__io_start(handle->loop,&handle->io_watcher,local_3c);
      if (((handle->flags & 4) == 0) &&
         (handle->flags = handle->flags | 4, (handle->flags & 8) != 0)) {
        handle->loop->active_handles = handle->loop->active_handles + 1;
      }
      handle->poll_cb = poll_cb;
      handle_local._4_4_ = 0;
    }
  }
  else {
    handle_local._4_4_ = -0x11;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_poll_start(uv_poll_t* handle, int pevents, uv_poll_cb poll_cb) {
  uv__io_t** watchers;
  uv__io_t* w;
  int events;

  assert((pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT |
                      UV_PRIORITIZED)) == 0);
  assert(!uv__is_closing(handle));

  watchers = handle->loop->watchers;
  w = &handle->io_watcher;

  if (uv__fd_exists(handle->loop, w->fd))
    if (watchers[w->fd] != w)
      return UV_EEXIST;

  uv__poll_stop(handle);

  if (pevents == 0)
    return 0;

  events = 0;
  if (pevents & UV_READABLE)
    events |= POLLIN;
  if (pevents & UV_PRIORITIZED)
    events |= UV__POLLPRI;
  if (pevents & UV_WRITABLE)
    events |= POLLOUT;
  if (pevents & UV_DISCONNECT)
    events |= UV__POLLRDHUP;

  uv__io_start(handle->loop, &handle->io_watcher, events);
  uv__handle_start(handle);
  handle->poll_cb = poll_cb;

  return 0;
}